

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QSize __thiscall
QDockAreaLayout::size_helper<QSize(QDockAreaLayoutInfo::*)()const,QSize(QLayoutItem::*)()const>
          (QDockAreaLayout *this,offset_in_QDockAreaLayoutInfo_to_subr sizeFn,
          offset_in_QLayoutItem_to_subr centerFn)

{
  long lVar1;
  int iVar2;
  code *in_RCX;
  long *plVar3;
  long in_RDX;
  code *in_RSI;
  int *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  int col3;
  int col2;
  int col1;
  int row3;
  int row2;
  int row1;
  int bottom_sep;
  int top_sep;
  int right_sep;
  int left_sep;
  QSize center;
  QSize bottom;
  QSize top;
  QSize right;
  QSize left;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  QSize *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  code *local_190;
  code *local_178;
  code *local_158;
  code *local_138;
  code *local_118;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 8) != 0) {
    QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x57ed1c);
    QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x57ed65);
    QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x57edb1);
    QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x57edfd);
  }
  plVar3 = (long *)((long)in_RDI + in_RDX + 0x40);
  local_118 = in_RSI;
  if (((ulong)in_RSI & 1) != 0) {
    local_118 = *(code **)(in_RSI + *plVar3 + -1);
  }
  (*local_118)(plVar3);
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
  ::operator+((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
              in_stack_fffffffffffffe58);
  plVar3 = (long *)((long)in_RDI + in_RDX + 0xb0);
  local_138 = in_RSI;
  if (((ulong)in_RSI & 1) != 0) {
    local_138 = *(code **)(in_RSI + *plVar3 + -1);
  }
  (*local_138)(plVar3);
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
  ::operator+((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
              in_stack_fffffffffffffe58);
  plVar3 = (long *)((long)in_RDI + in_RDX + 0x120);
  local_158 = in_RSI;
  if (((ulong)in_RSI & 1) != 0) {
    local_158 = *(code **)(in_RSI + *plVar3 + -1);
  }
  (*local_158)(plVar3);
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
  ::operator+((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
              in_stack_fffffffffffffe58);
  plVar3 = (long *)((long)in_RDI + in_RDX + 400);
  local_178 = in_RSI;
  if (((ulong)in_RSI & 1) != 0) {
    local_178 = *(code **)(in_RSI + *plVar3 + -1);
  }
  (*local_178)(plVar3);
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
  ::operator+((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
              in_stack_fffffffffffffe58);
  if (*(long *)(in_RDI + 8) == 0) {
    QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
  }
  else {
    local_190 = in_RCX;
    if (((ulong)in_RCX & 1) != 0) {
      local_190 = *(code **)(in_RCX + *(long *)(*(long *)(in_RDI + 8) + in_R8) + -1);
    }
    (*local_190)((long *)(*(long *)(in_RDI + 8) + in_R8));
  }
  QSize::width((QSize *)0x57f1f2);
  QSize::width((QSize *)0x57f206);
  QSize::width((QSize *)0x57f217);
  QSize::width((QSize *)0x57f230);
  QSize::width((QSize *)0x57f24c);
  QSize::height((QSize *)0x57f260);
  QSize::height((QSize *)0x57f274);
  QSize::height((QSize *)0x57f285);
  QSize::height((QSize *)0x57f29e);
  QSize::height((QSize *)0x57f2ba);
  if (*in_RDI == 1) {
    QSize::width((QSize *)0x57f2dd);
  }
  else {
    QSize::height((QSize *)0x57f2fa);
  }
  if (in_RDI[1] == 2) {
    QSize::width((QSize *)0x57f323);
  }
  else {
    QSize::height((QSize *)0x57f340);
  }
  if (in_RDI[2] == 1) {
    QSize::width((QSize *)0x57f369);
  }
  else {
    QSize::height((QSize *)0x57f386);
  }
  if (in_RDI[3] == 2) {
    QSize::width((QSize *)0x57f3af);
  }
  else {
    QSize::height((QSize *)0x57f3cc);
  }
  iVar2 = qMax(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,0);
  qMax(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,0);
  QSize::QSize((QSize *)CONCAT44(iVar2,in_stack_fffffffffffffe50),in_stack_fffffffffffffe4c,
               in_stack_fffffffffffffe48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockAreaLayout::size_helper(SizePMF sizeFn, CenterPMF centerFn) const
{
    int left_sep = 0;
    int right_sep = 0;
    int top_sep = 0;
    int bottom_sep = 0;

    if (centralWidgetItem != nullptr) {
        left_sep = docks[QInternal::LeftDock].isEmpty() ? 0 : sep;
        right_sep = docks[QInternal::RightDock].isEmpty() ? 0 : sep;
        top_sep = docks[QInternal::TopDock].isEmpty() ? 0 : sep;
        bottom_sep = docks[QInternal::BottomDock].isEmpty() ? 0 : sep;
    }

    const QSize left = (docks[QInternal::LeftDock].*sizeFn)() + QSize(left_sep, 0);
    const QSize right = (docks[QInternal::RightDock].*sizeFn)() + QSize(right_sep, 0);
    const QSize top = (docks[QInternal::TopDock].*sizeFn)() + QSize(0, top_sep);
    const QSize bottom = (docks[QInternal::BottomDock].*sizeFn)() + QSize(0, bottom_sep);
    const QSize center = centralWidgetItem == nullptr
                       ? QSize(0, 0) : (centralWidgetItem->*centerFn)();

    int row1 = top.width();
    int row2 = left.width() + center.width() + right.width();
    int row3 = bottom.width();
    int col1 = left.height();
    int col2 = top.height() + center.height() + bottom.height();
    int col3 = right.height();

    if (corners[Qt::TopLeftCorner] == Qt::LeftDockWidgetArea)
        row1 += left.width();
    else
        col1 += top.height();

    if (corners[Qt::TopRightCorner] == Qt::RightDockWidgetArea)
        row1 += right.width();
    else
        col3 += top.height();

    if (corners[Qt::BottomLeftCorner] == Qt::LeftDockWidgetArea)
        row3 += left.width();
    else
        col1 += bottom.height();

    if (corners[Qt::BottomRightCorner] == Qt::RightDockWidgetArea)
        row3 += right.width();
    else
        col3 += bottom.height();

    return QSize(qMax(row1, row2, row3), qMax(col1, col2, col3));
}